

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

void __thiscall QCompleter::setPopup(QCompleter *this,QAbstractItemView *popup)

{
  long lVar1;
  QAbstractItemView *this_00;
  QObject *parent;
  FocusPolicy policy;
  QItemSelectionModel *pQVar2;
  QAbstractItemModel *pQVar3;
  QStyledItemDelegate *this_01;
  QListView *this_02;
  QWidget *w;
  long in_FS_OFFSET;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if (*(QAbstractItemView **)(lVar1 + 0x90) != popup) {
    policy = NoFocus;
    if (((*(long *)(lVar1 + 0x78) != 0) &&
        (policy = NoFocus, *(int *)(*(long *)(lVar1 + 0x78) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x80) != 0)) {
      policy = QWidget::focusPolicy(*(QWidget **)(lVar1 + 0x80));
    }
    if (*(QAbstractItemView **)(lVar1 + 0x90) != (QAbstractItemView *)0x0) {
      pQVar2 = QAbstractItemView::selectionModel(*(QAbstractItemView **)(lVar1 + 0x90));
      QObject::disconnect((QObject *)pQVar2,(char *)0x0,&this->super_QObject,(char *)0x0);
      QObject::disconnect(*(QObject **)(lVar1 + 0x90),(char *)0x0,&this->super_QObject,(char *)0x0);
      if (*(long **)(lVar1 + 0x90) != (long *)0x0) {
        (**(code **)(**(long **)(lVar1 + 0x90) + 0x20))();
      }
    }
    *(QAbstractItemView **)(lVar1 + 0x90) = popup;
    pQVar3 = QAbstractItemView::model((QAbstractItemView *)popup);
    if (pQVar3 != *(QAbstractItemModel **)(lVar1 + 0x88)) {
      (**(code **)(**(long **)(lVar1 + 0x90) + 0x1c8))();
    }
    QWidget::hide(*(QWidget **)(lVar1 + 0x90));
    QWidget::setParent(*(QWidget **)(lVar1 + 0x90),(QWidget *)0x0);
    QWidget::setWindowFlag(*(QWidget **)(lVar1 + 0x90),Popup,true);
    QWidget::setFocusPolicy(*(QWidget **)(lVar1 + 0x90),NoFocus);
    if (((*(long *)(lVar1 + 0x78) != 0) && (*(int *)(*(long *)(lVar1 + 0x78) + 4) != 0)) &&
       (*(long *)(lVar1 + 0x80) != 0)) {
      QWidget::setFocusPolicy(*(QWidget **)(lVar1 + 0x80),policy);
    }
    if ((*(long *)(lVar1 + 0x78) == 0) || (*(int *)(*(long *)(lVar1 + 0x78) + 4) == 0)) {
      w = (QWidget *)0x0;
    }
    else {
      w = *(QWidget **)(lVar1 + 0x80);
    }
    QWidget::setFocusProxy(*(QWidget **)(lVar1 + 0x90),w);
    QObject::installEventFilter(*(QObject **)(lVar1 + 0x90));
    this_00 = *(QAbstractItemView **)(lVar1 + 0x90);
    this_01 = (QStyledItemDelegate *)operator_new(0x18);
    parent = *(QObject **)(lVar1 + 0x90);
    QStyledItemDelegate::QStyledItemDelegate(this_01,parent);
    *(undefined ***)this_01 = &PTR_metaObject_00823728;
    *(QObject **)(this_01 + 0x10) = parent;
    QAbstractItemView::setItemDelegate(this_00,(QAbstractItemDelegate *)this_01);
    this_02 = (QListView *)QMetaObject::cast((QObject *)&QListView::staticMetaObject);
    if (this_02 != (QListView *)0x0) {
      QListView::setModelColumn(this_02,*(int *)(lVar1 + 0xc0));
    }
    QObject::connect(local_40,*(char **)(lVar1 + 0x90),(QObject *)"2clicked(QModelIndex)",
                     (char *)this,0x70641f);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    QObject::connect(local_48,(char *)this,(QObject *)"2activated(QModelIndex)",
                     *(char **)(lVar1 + 0x90),0x706451);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    pQVar2 = QAbstractItemView::selectionModel(*(QAbstractItemView **)(lVar1 + 0x90));
    QObject::connect(local_50,(char *)pQVar2,
                     (QObject *)"2selectionChanged(QItemSelection,QItemSelection)",(char *)this,
                     0x70648a);
    QMetaObject::Connection::~Connection((Connection *)local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleter::setPopup(QAbstractItemView *popup)
{
    Q_ASSERT(popup);
    Q_D(QCompleter);
    if (popup == d->popup)
        return;

    // Remember existing widget's focus policy, default to NoFocus
    const Qt::FocusPolicy origPolicy = d->widget ? d->widget->focusPolicy()
                                                 : Qt::NoFocus;

    // If popup existed already, disconnect signals and delete object
    if (d->popup) {
        QObject::disconnect(d->popup->selectionModel(), nullptr, this, nullptr);
        QObject::disconnect(d->popup, nullptr, this, nullptr);
        delete d->popup;
    }

    // Assign new object, set model and hide
    d->popup = popup;
    if (d->popup->model() != d->proxy)
        d->popup->setModel(d->proxy);
    d->popup->hide();

    // Mark the widget window as a popup, so that if the last non-popup window is closed by the
    // user, the application should not be prevented from exiting. It needs to be set explicitly via
    // setWindowFlag(), because passing the flag via setParent(parent, windowFlags) does not call
    // QWidgetPrivate::adjustQuitOnCloseAttribute(), and causes an application not to exit if the
    // popup ends up being the last window.
    d->popup->setParent(nullptr);
    d->popup->setWindowFlag(Qt::Popup);
    d->popup->setFocusPolicy(Qt::NoFocus);
    if (d->widget)
        d->widget->setFocusPolicy(origPolicy);

    d->popup->setFocusProxy(d->widget);
    d->popup->installEventFilter(this);
    d->popup->setItemDelegate(new QCompleterItemDelegate(d->popup));
#if QT_CONFIG(listview)
    if (QListView *listView = qobject_cast<QListView *>(d->popup)) {
        listView->setModelColumn(d->column);
    }
#endif

    QObject::connect(d->popup, SIGNAL(clicked(QModelIndex)),
                     this, SLOT(_q_complete(QModelIndex)));
    QObject::connect(this, SIGNAL(activated(QModelIndex)),
                     d->popup, SLOT(hide()));

    QObject::connect(d->popup->selectionModel(), SIGNAL(selectionChanged(QItemSelection,QItemSelection)),
                     this, SLOT(_q_completionSelected(QItemSelection)));
}